

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int act_disp_exts(nt_opts *opts)

{
  nifti_image *nim_00;
  int local_50;
  uint local_4c;
  int fc;
  int ec;
  char mesg [32];
  nifti_image *nim;
  nt_opts *opts_local;
  
  if (2 < g_debug) {
    fprintf(_stderr,"-d displaying all extensions for %d files...\n",
            (ulong)(uint)(opts->infiles).len);
  }
  local_50 = 0;
  while( true ) {
    if ((opts->infiles).len <= local_50) {
      return 0;
    }
    nim_00 = nt_image_read(opts,(opts->infiles).list[local_50],0);
    if (nim_00 == (nifti_image *)0x0) break;
    if (0 < g_debug) {
      fprintf(_stdout,"header file \'%s\', num_ext = %d\n",nim_00->fname,
              (ulong)(uint)nim_00->num_ext);
    }
    for (local_4c = 0; (int)local_4c < nim_00->num_ext; local_4c = local_4c + 1) {
      sprintf((char *)&fc,"    ext #%d : ",(ulong)local_4c);
      disp_nifti1_extension((char *)&fc,nim_00->ext_list + (int)local_4c,-1);
    }
    nifti_image_free(nim_00);
    local_50 = local_50 + 1;
  }
  return 1;
}

Assistant:

int act_disp_exts( nt_opts * opts )
{
   nifti_image * nim;
   char          mesg[32];
   int           ec, fc;

   if( g_debug > 2 )
      fprintf(stderr,"-d displaying all extensions for %d files...\n",
              opts->infiles.len);

   for( fc = 0; fc < opts->infiles.len; fc++ )
   {
      nim = nt_image_read(opts, opts->infiles.list[fc], 0);
      if( !nim ) return 1;  /* errors are printed from library */

      if( g_debug > 0 )
         fprintf(stdout,"header file '%s', num_ext = %d\n",
                 nim->fname, nim->num_ext);
      for( ec = 0; ec < nim->num_ext; ec++ )
      {
         sprintf(mesg, "    ext #%d : ", ec);
         disp_nifti1_extension(mesg, nim->ext_list + ec, -1);
      }

      nifti_image_free(nim);
   }

   return 0;
}